

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O3

htmlElemDesc * htmlTagLookup(xmlChar *tag)

{
  int iVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    iVar1 = xmlStrcasecmp(tag,*(xmlChar **)((long)&html40ElementTable[0].name + lVar2));
    if (iVar1 == 0) {
      return (htmlElemDesc *)((long)&html40ElementTable[0].name + lVar2);
    }
    lVar2 = lVar2 + 0x40;
  } while (lVar2 != 0x1700);
  return (htmlElemDesc *)0x0;
}

Assistant:

const htmlElemDesc *
htmlTagLookup(const xmlChar *tag) {
    unsigned int i;

    for (i = 0; i < (sizeof(html40ElementTable) /
                     sizeof(html40ElementTable[0]));i++) {
        if (!xmlStrcasecmp(tag, BAD_CAST html40ElementTable[i].name))
	    return((htmlElemDescPtr) &html40ElementTable[i]);
    }
    return(NULL);
}